

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_exhaustive_pass.cpp
# Opt level: O1

Status __thiscall spvtools::opt::InlineExhaustivePass::ProcessImpl(InlineExhaustivePass *this)

{
  Status SVar1;
  Status status;
  Status local_3c;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._M_unused._M_object = &local_3c;
  local_3c = SuccessWithoutChange;
  pcStack_20 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_exhaustive_pass.cpp:64:25)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_exhaustive_pass.cpp:64:25)>
             ::_M_manager;
  local_38._8_8_ = this;
  IRContext::ProcessReachableCallTree
            ((this->super_InlinePass).super_Pass.context_,(ProcessFunction *)&local_38);
  SVar1 = local_3c;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return SVar1;
}

Assistant:

Pass::Status InlineExhaustivePass::ProcessImpl() {
  Status status = Status::SuccessWithoutChange;
  // Attempt exhaustive inlining on each entry point function in module
  ProcessFunction pfn = [&status, this](Function* fp) {
    status = CombineStatus(status, InlineExhaustive(fp));
    return false;
  };
  context()->ProcessReachableCallTree(pfn);
  return status;
}